

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

UnknownFieldSet *
google::protobuf::Arena::CreateArenaCompatible<google::protobuf::UnknownFieldSet>(Arena *arena)

{
  UnknownFieldSet *pUVar1;
  ShortSooRep *this;
  
  if (arena != (Arena *)0x0) {
    pUVar1 = DoCreateMessage<google::protobuf::UnknownFieldSet>(arena);
    return pUVar1;
  }
  this = (ShortSooRep *)operator_new(0x10);
  internal::ShortSooRep::ShortSooRep(this,(Arena *)0x0);
  return (UnknownFieldSet *)this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* PROTOBUF_NONNULL
  CreateArenaCompatible(Arena* PROTOBUF_NULLABLE arena) {
    static_assert(is_arena_constructable<T>::value,
                  "Can only construct types that are ArenaConstructable");
    if (ABSL_PREDICT_FALSE(arena == nullptr)) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }